

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# no_operator_caching_verifier.cpp
# Opt level: O0

void __thiscall
duckdb::NoOperatorCachingVerifier::NoOperatorCachingVerifier
          (NoOperatorCachingVerifier *this,
          unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>
          *statement_p,
          optional_ptr<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData>_>_>,_true>
          parameters)

{
  StatementVerifier *in_RDX;
  string *in_RSI;
  undefined8 *in_RDI;
  optional_ptr<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData>_>_>,_true>
  unaff_retaddr;
  unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>
  *in_stack_ffffffffffffff78;
  unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true> local_58 [3];
  allocator local_39;
  string local_38 [24];
  unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>
  *in_stack_ffffffffffffffe0;
  undefined8 *puVar1;
  VerificationType type;
  
  puVar1 = in_RDI;
  ::std::allocator<char>::allocator();
  type = (VerificationType)((ulong)puVar1 >> 0x38);
  ::std::__cxx11::string::string(local_38,"No operator caching",&local_39);
  unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>::unique_ptr
            (local_58,in_stack_ffffffffffffff78);
  StatementVerifier::StatementVerifier(in_RDX,type,in_RSI,in_stack_ffffffffffffffe0,unaff_retaddr);
  unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>::~unique_ptr
            ((unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true> *)
             0xcd76ca);
  ::std::__cxx11::string::~string(local_38);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_39);
  *in_RDI = &PTR__NoOperatorCachingVerifier_035143b8;
  return;
}

Assistant:

NoOperatorCachingVerifier::NoOperatorCachingVerifier(
    unique_ptr<SQLStatement> statement_p, optional_ptr<case_insensitive_map_t<BoundParameterData>> parameters)
    : StatementVerifier(VerificationType::NO_OPERATOR_CACHING, "No operator caching", std::move(statement_p),
                        parameters) {
}